

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBlock * AnalyzeNamespaceDefinition(ExpressionContext *ctx,SynNamespaceDefinition *syntax)

{
  uint uniqueId;
  IntrusiveList<ExprBase> expressions_00;
  NamespaceData *parent_00;
  NamespaceData *this;
  ExprBase *node;
  ExprBlock *this_00;
  SynIdentifier *local_68;
  SynIdentifier *name_1;
  ExprBlock *block;
  SynBase *expression;
  IntrusiveList<ExprBase> expressions;
  NamespaceData *ns;
  NamespaceData *parent;
  SynIdentifier *name;
  SynNamespaceDefinition *syntax_local;
  ExpressionContext *ctx_local;
  
  if ((ctx->scope != ctx->globalScope) && (ctx->scope->ownerNamespace == (NamespaceData *)0x0)) {
    anon_unknown.dwarf_e7629::Stop
              (ctx,&syntax->super_SynBase,
               "ERROR: a namespace definition must appear either at file scope or immediately within another namespace definition"
              );
  }
  for (parent = (NamespaceData *)(syntax->path).head; parent != (NamespaceData *)0x0;
      parent = (NamespaceData *)getType<SynIdentifier>((SynBase *)(parent->children).little[1])) {
    parent_00 = ExpressionContext::GetCurrentNamespace(ctx,ctx->scope);
    this = ExpressionContext::get<NamespaceData>(ctx);
    uniqueId = ctx->uniqueNamespaceId;
    ctx->uniqueNamespaceId = uniqueId + 1;
    NamespaceData::NamespaceData
              (this,ctx->allocator,&syntax->super_SynBase,ctx->scope,parent_00,
               (SynIdentifier *)parent,uniqueId);
    expressions.tail = (ExprBase *)this;
    anon_unknown.dwarf_e7629::CheckNamespaceConflict(ctx,&syntax->super_SynBase,this);
    if (parent_00 == (NamespaceData *)0x0) {
      SmallArray<NamespaceData_*,_2U>::push_back
                (&ctx->globalNamespaces,(NamespaceData **)&expressions.tail);
    }
    else {
      SmallArray<NamespaceData_*,_2U>::push_back
                (&parent_00->children,(NamespaceData **)&expressions.tail);
    }
    SmallArray<NamespaceData_*,_128U>::push_back
              (&ctx->namespaces,(NamespaceData **)&expressions.tail);
    ExpressionContext::PushScope(ctx,(NamespaceData *)expressions.tail);
  }
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&expression);
  for (block = (ExprBlock *)(syntax->expressions).head; block != (ExprBlock *)0x0;
      block = (ExprBlock *)(block->expressions).head) {
    node = AnalyzeStatement(ctx,(SynBase *)block);
    IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&expression,node);
  }
  this_00 = ExpressionContext::get<ExprBlock>(ctx);
  expressions_00.tail = expressions.head;
  expressions_00.head = (ExprBase *)expression;
  ExprBlock::ExprBlock(this_00,&syntax->super_SynBase,ctx->typeVoid,expressions_00,(ExprBase *)0x0);
  for (local_68 = (syntax->path).head; local_68 != (SynIdentifier *)0x0;
      local_68 = getType<SynIdentifier>((local_68->super_SynBase).next)) {
    ExpressionContext::PopScope(ctx,SCOPE_NAMESPACE);
  }
  return this_00;
}

Assistant:

ExprBlock* AnalyzeNamespaceDefinition(ExpressionContext &ctx, SynNamespaceDefinition *syntax)
{
	if(ctx.scope != ctx.globalScope && ctx.scope->ownerNamespace == NULL)
		Stop(ctx, syntax, "ERROR: a namespace definition must appear either at file scope or immediately within another namespace definition");

	for(SynIdentifier *name = syntax->path.head; name; name = getType<SynIdentifier>(name->next))
	{
		NamespaceData *parent = ctx.GetCurrentNamespace(ctx.scope);

		NamespaceData *ns = new (ctx.get<NamespaceData>()) NamespaceData(ctx.allocator, syntax, ctx.scope, parent, *name, ctx.uniqueNamespaceId++);

		CheckNamespaceConflict(ctx, syntax, ns);

		if(parent)
			parent->children.push_back(ns);
		else
			ctx.globalNamespaces.push_back(ns);

		ctx.namespaces.push_back(ns);

		ctx.PushScope(ns);
	}

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
		expressions.push_back(AnalyzeStatement(ctx, expression));

	ExprBlock *block = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, NULL);

	for(SynIdentifier *name = syntax->path.head; name; name = getType<SynIdentifier>(name->next))
		ctx.PopScope(SCOPE_NAMESPACE);

	return block;
}